

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O0

uint128 __thiscall absl::lts_20250127::operator>>(lts_20250127 *this,uint128 lhs,int amount)

{
  undefined1 v [16];
  ulong extraout_RDX;
  undefined8 in_stack_ffffffffffffff98;
  byte local_2c;
  lts_20250127 *plStack_28;
  int amount_local;
  uint128 lhs_local;
  
  lhs_local.lo_ = lhs.lo_;
  plStack_28 = this;
  uint128::operator_cast_to_unsigned___int128
            ((unsigned___int128 *)&stack0xffffffffffffffd8,(uint128 *)lhs_local.lo_);
  local_2c = (byte)lhs.hi_;
  v._8_8_ = extraout_RDX >> (local_2c & 0x3f);
  v._0_8_ = in_stack_ffffffffffffff98;
  uint128::uint128((uint128 *)&lhs_local.hi_,(unsigned___int128)v);
  return stack0xffffffffffffffe8;
}

Assistant:

constexpr uint128 operator>>(uint128 lhs, int amount) {
#ifdef ABSL_HAVE_INTRINSIC_INT128
  return static_cast<unsigned __int128>(lhs) >> amount;
#else
  // uint64_t shifts of >= 64 are undefined, so we will need some
  // special-casing.
  return amount >= 64  ? MakeUint128(0, Uint128High64(lhs) >> (amount - 64))
         : amount == 0 ? lhs
                       : MakeUint128(Uint128High64(lhs) >> amount,
                                     (Uint128Low64(lhs) >> amount) |
                                         (Uint128High64(lhs) << (64 - amount)));
#endif
}